

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O2

void __thiscall
wallet::CWallet::
WalletLogPrintf<long,int,int,int,std::__cxx11::string,double,double,double,double,double,double,double,double,double,double,double,double,double,double,double>
          (CWallet *this,char *fmt,long parameters,int parameters_1,int parameters_2,
          int parameters_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_4,
          double parameters_5,double parameters_6,double parameters_7,double parameters_8,
          double parameters_9,double parameters_10,double parameters_11,double parameters_12,
          double parameters_13,double parameters_14,double parameters_15,double parameters_16,
          double parameters_17,double parameters_18,double parameters_19)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  double *args_20;
  allocator<char> local_199;
  double parameters_local_11;
  double parameters_local_10;
  double parameters_local_9;
  double parameters_local_8;
  double parameters_local_7;
  double parameters_local_6;
  double parameters_local_5;
  double parameters_local_4;
  int parameters_local_3;
  int parameters_local_2;
  int parameters_local_1;
  long parameters_local;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [4];
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parameters_local_11 = parameters_12;
  parameters_local_10 = parameters_11;
  parameters_local_9 = parameters_10;
  parameters_local_8 = parameters_9;
  parameters_local_7 = parameters_8;
  parameters_local_6 = parameters_7;
  parameters_local_5 = parameters_6;
  parameters_local_4 = parameters_5;
  parameters_local_3 = parameters_3;
  parameters_local_2 = parameters_2;
  parameters_local_1 = parameters_1;
  parameters_local = parameters;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,fmt,&local_199);
  std::operator+(local_f8,"%s ",&local_118);
  GetDisplayName_abi_cxx11_(&local_138,this);
  pLVar3 = LogInstance();
  args_20 = (double *)0x45701e;
  bVar2 = BCLog::Logger::Enabled(pLVar3);
  if (bVar2) {
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    tinyformat::
    format<std::__cxx11::string,long,int,int,int,std::__cxx11::string,double,double,double,double,double,double,double,double,double,double,double,double,double,double,double>
              (&local_78,(tinyformat *)local_f8[0]._M_dataplus._M_p,(char *)&local_138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &parameters_local,(long *)&parameters_local_1,&parameters_local_2,&parameters_local_3
               ,(int *)parameters_4._M_dataplus._M_p,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &parameters_local_4,&parameters_local_5,&parameters_local_6,&parameters_local_7,
               &parameters_local_8,&parameters_local_9,&parameters_local_10,&parameters_local_11,
               (double *)&parameters_4._M_string_length,
               (double *)&parameters_4.field_2._M_allocated_capacity,
               (double *)((long)&parameters_4.field_2 + 8),&parameters_13,&parameters_14,
               &parameters_15,&parameters_16,args_20);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    pLVar3 = LogInstance();
    local_78._M_dataplus._M_p = (pointer)0x58;
    local_78._M_string_length = 0x6e4fa9;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h";
    source_file._M_len = 0x58;
    str._M_str = log_msg._M_dataplus._M_p;
    str._M_len = log_msg._M_string_length;
    logging_function._M_str = "WalletLogPrintf";
    logging_function._M_len = 0xf;
    BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x3a4,ALL,Info);
    std::__cxx11::string::~string((string *)&log_msg);
  }
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WalletLogPrintf(const char* fmt, Params... parameters) const
    {
        LogPrintf(("%s " + std::string{fmt}).c_str(), GetDisplayName(), parameters...);
    }